

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunningTest::addSection(RunningTest *this,string *name)

{
  bool bVar1;
  SectionInfo *local_28;
  SectionInfo *thisSection;
  string *name_local;
  RunningTest *this_local;
  
  if (this->m_runStatus == NothingRun) {
    this->m_runStatus = EncounteredASection;
  }
  local_28 = SectionInfo::findSubSection(this->m_currentSection,name);
  if (local_28 == (SectionInfo *)0x0) {
    local_28 = SectionInfo::addSubSection(this->m_currentSection,name);
    this->m_changed = true;
  }
  bVar1 = wasSectionSeen(this);
  if ((bVar1) || (bVar1 = SectionInfo::shouldRun(local_28), !bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    this->m_currentSection = local_28;
    this->m_lastSectionToRun = (SectionInfo *)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool addSection( const std::string& name ) {
            if( m_runStatus == NothingRun )
                m_runStatus = EncounteredASection;

            SectionInfo* thisSection = m_currentSection->findSubSection( name );
            if( !thisSection ) {
                thisSection = m_currentSection->addSubSection( name );
                m_changed = true;
            }

            if( !wasSectionSeen() && thisSection->shouldRun() ) {
                m_currentSection = thisSection;
                m_lastSectionToRun = NULL;
                return true;
            }
            return false;
        }